

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

void __thiscall ON_RenderContent::ON_RenderContent(ON_RenderContent *this,wchar_t *kind)

{
  ON_RenderContentPrivate *pOVar1;
  ON_UUID uuid;
  ON_UUID local_120;
  ON_XMLVariant local_110;
  
  ON_ModelComponent::ON_ModelComponent(&this->super_ON_ModelComponent,RenderContent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0082a8d0;
  ON_RenderContentPrivate::ON_RenderContentPrivate
            ((ON_RenderContentPrivate *)this->_PRIVATE,this,kind);
  this->_private = (ON_RenderContentPrivate *)this->_PRIVATE;
  ON_CreateUuid(&uuid);
  ON_ModelComponent::SetId(&this->super_ON_ModelComponent,&uuid);
  pOVar1 = this->_private;
  local_120.Data1 = 0x16592d58;
  local_120.Data2 = 0x4a2f;
  local_120.Data3 = 0x401d;
  local_120.Data4[0] = 0xbf;
  local_120.Data4[1] = '^';
  local_120.Data4[2] = ';';
  local_120.Data4[3] = 0x87;
  local_120.Data4[4] = 't';
  local_120.Data4[5] = '\x1c';
  local_120.Data4[6] = '\x1b';
  local_120.Data4[7] = '\x1b';
  ::ON_XMLVariant::ON_XMLVariant(&local_110,&local_120);
  ON_RenderContentPrivate::InternalSetPropertyValue(pOVar1,L"plug-in-id",&local_110);
  ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  pOVar1 = this->_private;
  ::ON_XMLVariant::ON_XMLVariant(&local_110,&ON_UniversalRenderEngineId);
  ON_RenderContentPrivate::InternalSetPropertyValue(pOVar1,L"render-engine-id",&local_110);
  ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  return;
}

Assistant:

ON_RenderContent::ON_RenderContent(const wchar_t* kind)
  :
  ON_ModelComponent(ON_ModelComponent::Type::RenderContent)
{
  _private = new (_PRIVATE) ON_RenderContentPrivate(*this, kind); PRIVATE_CHECK(ON_RenderContentPrivate);

  // Set a unique instance id.
  ON_UUID uuid;
  ON_CreateUuid(uuid);
  SetId(uuid);

  // Set the plug-in id to the RDK plug-in id.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_PLUG_IN_ID, RdkPlugInId());

  // Set the render engine id to 'universal'.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_RENDER_ENGINE_ID, ON_UniversalRenderEngineId);
}